

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O0

void __thiscall google::protobuf::json_internal::Mark::Discard(Mark *this)

{
  BufferingGuard local_18;
  Mark *local_10;
  Mark *this_local;
  
  local_10 = this;
  BufferingGuard::BufferingGuard(&local_18,(ZeroCopyBufferedStream *)0x0);
  BufferingGuard::operator=(&this->guard_,&local_18);
  BufferingGuard::~BufferingGuard(&local_18);
  return;
}

Assistant:

void Discard() && { guard_ = BufferingGuard(); }